

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

int eval_expr(Expr *tree,lword *result)

{
  Expr *in_RSI;
  uint *in_RDI;
  lword rval;
  lword lval;
  lword val;
  int rabs;
  int labs;
  int abs;
  char *fn;
  bool local_4a;
  bool local_49;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  int local_24;
  int local_20;
  uint local_1c;
  char *result_00;
  
  result_00 = "eval_expr: ";
  local_1c = 1;
  local_20 = 0;
  local_24 = 0;
  local_30 = 0;
  if (in_RDI == (uint *)0x0) {
    ierror("%sNULL tree","eval_expr: ");
  }
  else {
    if (*(long *)(in_RDI + 2) != 0) {
      local_20 = eval_expr(in_RSI,(lword *)"eval_expr: ");
      local_1c = (uint)(local_20 != 0);
    }
    if ((*(long *)(in_RDI + 4) != 0) &&
       (local_24 = eval_expr(in_RSI,(lword *)result_00), local_24 == 0)) {
      local_1c = 0;
    }
    switch(*in_RDI) {
    case 0:
      local_30 = local_38 + local_40;
      break;
    case 1:
      local_30 = local_38 - local_40;
      if ((local_20 == 0) && (local_24 == 0)) {
        local_1c = 1;
      }
      break;
    case 2:
      local_30 = local_38 * local_40;
      break;
    case 3:
      if (local_40 == 0) {
        error(0x67,scriptname,(ulong)(uint)line);
        local_30 = 0;
      }
      else {
        local_30 = (long)local_38 / (long)local_40;
      }
      break;
    case 4:
      if (local_40 == 0) {
        error(0x67,scriptname,(ulong)(uint)line);
        local_30 = 0;
      }
      else {
        local_30 = (long)local_38 % (long)local_40;
      }
      break;
    case 5:
      local_30 = -local_38;
      break;
    case 6:
      local_30 = local_38 ^ 0xffffffffffffffff;
      break;
    case 7:
      local_49 = local_38 != 0 && local_40 != 0;
      local_30 = (ulong)(int)(uint)local_49;
      break;
    case 8:
      local_4a = local_38 != 0 || local_40 != 0;
      local_30 = (ulong)(int)(uint)local_4a;
      break;
    case 9:
      local_30 = local_38 & local_40;
      break;
    case 10:
      local_30 = local_38 | local_40;
      break;
    case 0xb:
      local_30 = local_38 ^ local_40;
      break;
    case 0xc:
      local_30 = (ulong)(int)(uint)((local_38 != 0 ^ 0xffU) & 1);
      break;
    case 0xd:
      local_30 = local_38 << ((byte)local_40 & 0x3f);
      break;
    case 0xe:
      local_30 = (long)local_38 >> ((byte)local_40 & 0x3f);
      break;
    case 0xf:
      local_30 = (ulong)(int)(uint)((long)local_38 < (long)local_40);
      break;
    case 0x10:
      local_30 = (ulong)(int)(uint)((long)local_40 < (long)local_38);
      break;
    case 0x11:
      local_30 = (ulong)(int)(uint)((long)local_38 <= (long)local_40);
      break;
    case 0x12:
      local_30 = (ulong)(int)(uint)((long)local_40 <= (long)local_38);
      break;
    case 0x13:
      local_30 = (ulong)(int)(uint)(local_38 != local_40);
      break;
    case 0x14:
      local_30 = (ulong)(int)(uint)(local_38 == local_40);
      break;
    case 0x16:
      local_1c = 0;
    case 0x15:
      local_30 = *(ulong *)(in_RDI + 6);
      break;
    default:
      ierror("%sIllegal tree type %d",result_00,(ulong)*in_RDI);
    }
  }
  *(ulong *)in_RSI = local_30;
  return local_1c;
}

Assistant:

static int eval_expr(struct Expr *tree,lword *result)
/* evaluate expression tree, returns !0 when result is absolute */
{
  const char *fn = "eval_expr: ";
  int abs = 1;
  int labs=0,rabs=0;
  lword val=0,lval,rval;

  if (tree) {
    if (tree->left) {
      if (!(labs = eval_expr(tree->left,&lval)))
        abs = 0;
    }
    if (tree->right) {
      if (!(rabs = eval_expr(tree->right,&rval)))
        abs = 0;
    }

    switch(tree->type) {
      case ADD:
        val = lval + rval;
        break;
      case SUB:
        val = lval - rval;
        if (!labs && !rabs)
          abs = 1;  /* result is absolute, when both are reloc */
        break;
      case MUL:
        val = lval * rval;
        break;
      case DIV:
        if (rval == 0) {
          error(103,scriptname,line);  /* Division by zero */
          val = 0;
        }
        else
          val = lval / rval;
        break;
      case MOD:
        if (rval == 0) {
          error(103,scriptname,line);  /* Division by zero */
          val = 0;
        }
        else
          val = lval % rval;
        break;
      case NEG:
        val = -lval;
        break;
      case CPL:
        val = ~lval;
        break;
      case LAND:
        val = lval && rval;
        break;
      case LOR:
        val = lval || rval;
        break;
      case BAND:
        val = lval & rval;
        break;
      case BOR:
        val = lval | rval;
        break;
      case XOR:
        val = lval ^ rval;
        break;
      case NOT:
        val = !lval;
        break;
      case LSH:
        val = lval << rval;
        break;
      case RSH:
        val = lval >> rval;
        break;
      case LT:
        val = lval < rval;
        break;
      case GT:
        val = lval > rval;
        break;
      case LEQ:
        val = lval <= rval;
        break;
      case GEQ:
        val = lval >= rval;
        break;
      case NEQ:
        val = lval != rval;
        break;
      case EQ:
        val = lval == rval;
        break;
      case REL:
        abs = 0;
      case ABS:
        val = tree->val;
        break;
      default:
        ierror("%sIllegal tree type %d",fn,tree->type);
        break;
    }
  }
  else
    ierror("%sNULL tree",fn);

  *result = val;
  return abs;
}